

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

lbool __thiscall Gluco::Solver::solve_(Solver *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  lbool *plVar7;
  int local_78;
  lbool local_55;
  int callback_result;
  lbool local_4f;
  lbool local_4e;
  lbool local_4d;
  int i_1;
  int *piStack_48;
  int message;
  int *pCex;
  double local_38;
  double finalTime;
  lbool local_28;
  lbool local_27;
  uint8_t local_26;
  lbool local_25;
  int i;
  double dStack_20;
  int curr_restarts;
  double curTime;
  Solver *this_local;
  lbool status;
  
  curTime = (double)this;
  if ((this->incremental != 0) && ((this->certifiedUNSAT & 1U) != 0)) {
    printf("Can not use incremental and certified unsat in the same time\n");
    exit(-1);
  }
  vec<Gluco::lbool>::clear(&this->model,false);
  vec<Gluco::Lit>::clear(&this->conflict,false);
  if ((this->ok & 1U) == 0) {
    lbool::lbool((lbool *)((long)&this_local + 7),'\x01');
  }
  else {
    dStack_20 = cpuTime();
    this->solves = this->solves + 1;
    lbool::lbool((lbool *)((long)&this_local + 7),'\x02');
    if ((this->incremental == 0) && (0 < this->verbosity)) {
      printf(
            "c ========================================[ MAGIC CONSTANTS ]==============================================\n"
            );
      printf(
            "c | Constants are supposed to work well together :-)                                                      |\n"
            );
      printf(
            "c | however, if you find better choices, please let us known...                                           |\n"
            );
      printf(
            "c |-------------------------------------------------------------------------------------------------------|\n"
            );
      printf(
            "c |                                |                                |                                     |\n"
            );
      printf(
            "c | - Restarts:                    | - Reduce Clause DB:            | - Minimize Asserting:               |\n"
            );
      uVar3 = bqueue<unsigned_int>::maxSize(&this->lbdQueue);
      printf("c |   * LBD Queue    : %6d      |   * First     : %6d         |    * size < %3d                     |\n"
             ,(ulong)uVar3,(ulong)(uint)this->nbclausesbeforereduce,
             (ulong)(uint)this->lbSizeMinimizingClause);
      uVar3 = bqueue<unsigned_int>::maxSize(&this->trailQueue);
      printf("c |   * Trail  Queue : %6d      |   * Inc       : %6d         |    * lbd  < %3d                     |\n"
             ,(ulong)uVar3,(ulong)(uint)this->incReduceDB);
      printf("c |   * K            : %6.2f      |   * Special   : %6d         |                                     |\n"
             ,this->K,(ulong)(uint)this->specialIncReduceDB);
      printf("c |   * R            : %6.2f      |   * Protected :  (lbd)< %2d     |                                     |\n"
             ,this->R,(ulong)this->lbLBDFrozenClause);
      printf(
            "c |                                |                                |                                     |\n"
            );
      printf("c ==================================[ Search Statistics (every %6d conflicts) ]=========================\n"
             ,(ulong)(uint)this->verbEveryConflicts);
      printf(
            "c |                                                                                                       |\n"
            );
      printf(
            "c |          RESTARTS           |          ORIGINAL         |              LEARNT              | Progress |\n"
            );
      printf(
            "c |       NB   Blocked  Avg Cfc |    Vars  Clauses Literals |   Red   Learnts    LBD2  Removed |          |\n"
            );
      printf(
            "c =========================================================================================================\n"
            );
    }
    i = 0;
    while( true ) {
      lbool::lbool(&local_25,'\x02');
      bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),local_25);
      if (!bVar2) break;
      local_26 = (uint8_t)search(this,0);
      this_local._7_1_ = (lbool)local_26;
      bVar2 = withinBudget(this);
      if ((((!bVar2) || ((this->terminate_search_early & 1U) != 0)) ||
          ((this->pstop != (int *)0x0 && (*this->pstop != 0)))) ||
         ((this->nRuntimeLimit != 0 && (uVar6 = ::Abc_Clock(), this->nRuntimeLimit < uVar6))))
      break;
      i = i + 1;
    }
    if ((this->incremental == 0) && (0 < this->verbosity)) {
      printf(
            "c =========================================================================================================\n"
            );
    }
    if ((this->certifiedUNSAT & 1U) != 0) {
      lbool::lbool(&local_27,'\x01');
      bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),local_27);
      if (bVar2) {
        fprintf((FILE *)this->certifiedOutput,"0\n");
      }
      fclose((FILE *)this->certifiedOutput);
    }
    lbool::lbool(&local_28,'\0');
    bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),local_28);
    if (bVar2) {
      iVar5 = nVars(this);
      vec<Gluco::lbool>::growTo(&this->model,iVar5);
      for (finalTime._4_4_ = 0; iVar5 = finalTime._4_4_, iVar4 = nVars(this), iVar5 < iVar4;
          finalTime._4_4_ = finalTime._4_4_ + 1) {
        finalTime._3_1_ = value(this,finalTime._4_4_);
        plVar7 = vec<Gluco::lbool>::operator[](&this->model,finalTime._4_4_);
        plVar7->value = finalTime._3_1_;
      }
    }
    else {
      lbool::lbool((lbool *)((long)&finalTime + 2),'\x01');
      bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),finalTime._2_1_);
      if ((bVar2) && (iVar5 = vec<Gluco::Lit>::size(&this->conflict), iVar5 == 0)) {
        this->ok = false;
      }
    }
    cancelUntil(this,0);
    local_38 = cpuTime();
    lbool::lbool((lbool *)((long)&pCex + 7),'\0');
    bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),pCex._7_1_);
    if (bVar2) {
      this->nbSatCalls = this->nbSatCalls + 1;
      this->totalTime4Sat = (local_38 - dStack_20) + this->totalTime4Sat;
    }
    lbool::lbool((lbool *)((long)&pCex + 6),'\x01');
    bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),pCex._6_1_);
    if (bVar2) {
      this->nbUnsatCalls = this->nbUnsatCalls + 1;
      this->totalTime4Unsat = (local_38 - dStack_20) + this->totalTime4Unsat;
    }
    if ((this->pCnfFunc == (_func_int_void_ptr_int_int_ptr *)0x0) ||
       ((this->terminate_search_early & 1U) != 0)) {
      if (this->pCnfFunc != (_func_int_void_ptr_int_int_ptr *)0x0) {
        this->terminate_search_early = false;
      }
    }
    else {
      piStack_48 = (int *)0x0;
      lbool::lbool(&local_4d,'\0');
      bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),local_4d);
      if (bVar2) {
        local_78 = 1;
      }
      else {
        lbool::lbool(&local_4e,'\x01');
        bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),local_4e);
        local_78 = -1;
        if (bVar2) {
          local_78 = 0;
        }
      }
      i_1 = local_78;
      lbool::lbool(&local_4f,'\0');
      bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),local_4f);
      if (bVar2) {
        iVar5 = nVars(this);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)iVar5;
        uVar6 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        piStack_48 = (int *)operator_new__(uVar6);
        for (callback_result = 0; iVar5 = callback_result, iVar4 = nVars(this), iVar5 < iVar4;
            callback_result = callback_result + 1) {
          plVar7 = vec<Gluco::lbool>::operator[](&this->model,callback_result);
          lbool::lbool(&local_55,'\0');
          bVar2 = lbool::operator==(plVar7,local_55);
          piStack_48[callback_result] = (uint)bVar2;
        }
      }
      iVar5 = (*this->pCnfFunc)(this->pCnfMan,i_1,piStack_48);
      if (iVar5 != 0) {
        __assert_fail("callback_result == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x511,"lbool Gluco::Solver::solve_()");
      }
    }
  }
  return (lbool)this_local._7_1_;
}

Assistant:

lbool Solver::solve_()
{

  if(incremental && certifiedUNSAT) {
    printf("Can not use incremental and certified unsat in the same time\n");
    exit(-1);
  }
    model.clear();
    conflict.clear();
    if (!ok) return l_False;
    double curTime = cpuTime();

    
    solves++;
            

    
    lbool   status        = l_Undef;
    if(!incremental && verbosity>=1) {
      printf("c ========================================[ MAGIC CONSTANTS ]==============================================\n");
      printf("c | Constants are supposed to work well together :-)                                                      |\n");
      printf("c | however, if you find better choices, please let us known...                                           |\n");
      printf("c |-------------------------------------------------------------------------------------------------------|\n");
    printf("c |                                |                                |                                     |\n"); 
    printf("c | - Restarts:                    | - Reduce Clause DB:            | - Minimize Asserting:               |\n");
    printf("c |   * LBD Queue    : %6d      |   * First     : %6d         |    * size < %3d                     |\n",lbdQueue.maxSize(),nbclausesbeforereduce,lbSizeMinimizingClause);
    printf("c |   * Trail  Queue : %6d      |   * Inc       : %6d         |    * lbd  < %3d                     |\n",trailQueue.maxSize(),incReduceDB,lbLBDMinimizingClause);
    printf("c |   * K            : %6.2f      |   * Special   : %6d         |                                     |\n",K,specialIncReduceDB);
    printf("c |   * R            : %6.2f      |   * Protected :  (lbd)< %2d     |                                     |\n",R,lbLBDFrozenClause);
    printf("c |                                |                                |                                     |\n"); 
printf("c ==================================[ Search Statistics (every %6d conflicts) ]=========================\n",verbEveryConflicts);
      printf("c |                                                                                                       |\n"); 

      printf("c |          RESTARTS           |          ORIGINAL         |              LEARNT              | Progress |\n");
      printf("c |       NB   Blocked  Avg Cfc |    Vars  Clauses Literals |   Red   Learnts    LBD2  Removed |          |\n");
      printf("c =========================================================================================================\n");
    }

    // Search:
    int curr_restarts = 0;
    while (status == l_Undef){
      status = search(0); // the parameter is useless in glucose, kept to allow modifications
        if (!withinBudget() || terminate_search_early || (pstop && *pstop)) break;
        if (nRuntimeLimit && Abc_Clock() > nRuntimeLimit)                   break;
        curr_restarts++;
    }

    if (!incremental && verbosity >= 1)
      printf("c =========================================================================================================\n");


    if (certifiedUNSAT){ // Want certified output
      if (status == l_False)
        fprintf(certifiedOutput, "0\n");
      fclose(certifiedOutput);
    }


    if (status == l_True){
        // Extend & copy model:
        model.growTo(nVars());
        for (int i = 0; i < nVars(); i++) model[i] = value(i);
    }else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);

    double finalTime = cpuTime();
    if(status==l_True) {
      nbSatCalls++; 
      totalTime4Sat +=(finalTime-curTime);
    }
    if(status==l_False) {
      nbUnsatCalls++; 
      totalTime4Unsat +=(finalTime-curTime);
    }

    // ABC callback
    if (pCnfFunc && !terminate_search_early) {// hack to avoid calling callback twise if the solver was terminated early
        int * pCex = NULL;
        int message = (status == l_True ? 1 : status == l_False ? 0 : -1);
        if (status == l_True) {
            pCex = new int[nVars()];
            for (int i = 0; i < nVars(); i++)
                pCex[i] = (model[i] == l_True);
        }
        
        int callback_result = pCnfFunc(pCnfMan, message, pCex);
        assert(callback_result == 0);
    }
    else if (pCnfFunc)
        terminate_search_early = false; // for next run

    return status;
}